

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t archive_read_disk_set_uname_lookup
                  (archive *_a,void *private_data,_func_char_ptr_void_ptr_int64_t *lookup_uname,
                  _func_void_void_ptr *cleanup_uname)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_set_uname_lookup");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    if ((_a[1].sconv != (archive_string_conv *)0x0) && (_a[1].read_data_block != (char *)0x0)) {
      (*(code *)_a[1].sconv)();
    }
    *(_func_char_ptr_void_ptr_int64_t **)&_a[1].current_codepage = lookup_uname;
    _a[1].sconv = (archive_string_conv *)cleanup_uname;
    _a[1].read_data_block = (char *)private_data;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
archive_read_disk_set_uname_lookup(struct archive *_a,
    void *private_data,
    const char * (*lookup_uname)(void *private, int64_t uid),
    void (*cleanup_uname)(void *private))
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_set_uname_lookup");

	if (a->cleanup_uname != NULL && a->lookup_uname_data != NULL)
		(a->cleanup_uname)(a->lookup_uname_data);

	a->lookup_uname = lookup_uname;
	a->cleanup_uname = cleanup_uname;
	a->lookup_uname_data = private_data;
	return (ARCHIVE_OK);
}